

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
advance_past_space_character
          (jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this)

{
  jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *this_local;
  
  switch(*this->p_) {
  case '\t':
  case ' ':
    this->p_ = this->p_ + 1;
    this->column_ = this->column_ + 1;
    break;
  case '\n':
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    this->p_ = this->p_ + 1;
    break;
  default:
    break;
  case '\r':
    if ((this->p_ + 1 < this->end_input_) && (this->p_[1] == '\n')) {
      this->p_ = this->p_ + 1;
    }
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    this->p_ = this->p_ + 1;
  }
  return;
}

Assistant:

void advance_past_space_character()
        {
            switch (*p_)
            {
                case ' ':case '\t':
                    ++p_;
                    ++column_;
                    break;
                case '\r':
                    if (p_+1 < end_input_)
                    {
                        if (*(p_ + 1) == '\n')
                            ++p_;
                    }
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                case '\n':
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                default:
                    break;
            }
        }